

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O1

void __thiscall AutoArgParse::FlagStore::parse(FlagStore *this,ArgIter *first,ArgIter *last)

{
  pointer puVar1;
  ArgBase *pAVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  MissingMandatoryArgException *this_00;
  UnexpectedArgException *pUVar6;
  int iVar7;
  pointer_____offset_0x10___ *ppuVar8;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  pointer puVar9;
  Policy foundPolicy;
  Policy local_80;
  int local_7c;
  FlagStore *local_78;
  string local_70;
  string local_50;
  
  iVar7 = 0;
  local_7c = 0;
  local_78 = this;
  do {
    if (first->_M_current == last->_M_current) break;
    bVar4 = tryParseFlag(this,first,last,&local_80);
    if (bVar4) {
      iVar7 = iVar7 + (uint)(local_80 == MANDATORY);
      bVar4 = true;
    }
    else {
      puVar1 = (this->args).
               super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar9 = (this->args).
                    super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; bVar4 = puVar9 != puVar1, bVar4;
          puVar9 = puVar9 + 1) {
        pAVar2 = (puVar9->_M_t).
                 super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
                 .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
        iVar5 = 3;
        if ((pAVar2->super_ParseToken)._parsed == false) {
          (**(code **)((long)(pAVar2->super_ParseToken)._vptr_ParseToken + 0x10))(pAVar2,first,last)
          ;
          pAVar2 = (puVar9->_M_t).
                   super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
                   .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
          iVar5 = 0;
          if ((pAVar2->super_ParseToken)._parsed == true) {
            local_80 = (pAVar2->super_ParseToken).policy;
            iVar5 = 1;
          }
        }
        if ((iVar5 != 3) && (iVar5 != 0)) break;
      }
      this = local_78;
      if (bVar4) {
        local_7c = local_7c + (uint)(local_80 == MANDATORY);
      }
    }
  } while (bVar4);
  if (iVar7 == this->_numberMandatoryFlags) {
    if (local_7c == this->_numberMandatoryArgs) {
      return;
    }
    if (first->_M_current != last->_M_current) {
      pUVar6 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar3 = (first->_M_current->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + first->_M_current->_M_string_length);
      UnexpectedArgException::UnexpectedArgException(pUVar6,&local_70,this);
      __cxa_throw(pUVar6,&UnexpectedArgException::typeinfo,
                  UnexpectedArgException::~UnexpectedArgException);
    }
    this_00 = (MissingMandatoryArgException *)__cxa_allocate_exception(0x38);
    MissingMandatoryArgException::MissingMandatoryArgException(this_00,this);
    ppuVar8 = &MissingMandatoryArgException::typeinfo;
  }
  else {
    if (first->_M_current != last->_M_current) {
      pUVar6 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar3 = (first->_M_current->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + first->_M_current->_M_string_length);
      UnexpectedArgException::UnexpectedArgException(pUVar6,&local_50,this);
      __cxa_throw(pUVar6,&UnexpectedArgException::typeinfo,
                  UnexpectedArgException::~UnexpectedArgException);
    }
    this_00 = (MissingMandatoryArgException *)__cxa_allocate_exception(0x38);
    MissingMandatoryFlagException::MissingMandatoryFlagException
              ((MissingMandatoryFlagException *)this_00,this);
    ppuVar8 = &MissingMandatoryFlagException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar8,ParseException::~ParseException);
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::parse(ArgIter& first, ArgIter& last) {
    int numberParsedMandatoryFlags = 0;
    int numberParsedMandatoryArgs = 0;
    while (first != last) {
        Policy foundPolicy;
        if (tryParseFlag(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryFlags++;
            }
        } else if (tryParseArg(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryArgs++;
            }
        } else {
            break;
        }
    }
    if (numberParsedMandatoryFlags != _numberMandatoryFlags) {
        if (first == last) {
            throw MissingMandatoryFlagException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
    if (numberParsedMandatoryArgs != _numberMandatoryArgs) {
        if (first == last) {
            throw MissingMandatoryArgException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
}